

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O2

int Curl_hash_delete(curl_hash *h,void *key,size_t key_len)

{
  curl_llist *pcVar1;
  curl_llist_element *e;
  size_t sVar2;
  size_t sVar3;
  curl_llist *pcVar4;
  
  pcVar1 = h->table;
  sVar2 = (*h->hash_func)(key,key_len,(long)h->slots);
  pcVar4 = pcVar1 + sVar2;
  while( true ) {
    e = pcVar4->head;
    if (e == (curl_llist_element *)0x0) {
      return 1;
    }
    sVar3 = (*h->comp_func)((void *)((long)e->ptr + 0x28),*(size_t *)((long)e->ptr + 0x20),key,
                            key_len);
    if (sVar3 != 0) break;
    pcVar4 = (curl_llist *)&e->next;
  }
  Curl_llist_remove(pcVar1 + sVar2,e,h);
  h->size = h->size - 1;
  return 0;
}

Assistant:

int Curl_hash_delete(struct curl_hash *h, void *key, size_t key_len)
{
  struct curl_llist_element *le;
  struct curl_hash_element  *he;
  struct curl_llist *l = FETCH_LIST(h, key, key_len);

  for(le = l->head; le; le = le->next) {
    he = le->ptr;
    if(h->comp_func(he->key, he->key_len, key, key_len)) {
      Curl_llist_remove(l, le, (void *) h);
      --h->size;
      return 0;
    }
  }
  return 1;
}